

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amd64.cpp
# Opt level: O0

void stackjit::Amd64Backend::moveMemoryRegWithIntOffsetToReg
               (CodeGen *codeGen,FloatRegisters dest,Registers srcMemReg,int offset)

{
  ulong local_30;
  size_t i;
  IntToBytes converter;
  Registers local_1c;
  value_type_conflict1 local_1b [3];
  int local_18;
  Registers local_12;
  FloatRegisters local_11;
  int offset_local;
  Registers srcMemReg_local;
  FloatRegisters dest_local;
  CodeGen *codeGen_local;
  
  local_18 = offset;
  local_12 = srcMemReg;
  local_11 = dest;
  _offset_local = codeGen;
  if (srcMemReg == SP) {
    converter.byteValues[3] = 0xf3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (codeGen,converter.byteValues + 3);
    converter.byteValues[2] = '\x0f';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_offset_local,converter.byteValues + 2);
    converter.byteValues[1] = '\x10';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_offset_local,converter.byteValues + 1);
    converter.byteValues[0] = local_11 << 3 | 0x84;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_offset_local,converter.byteValues);
    i._7_1_ = 0x24;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_offset_local,(value_type_conflict1 *)((long)&i + 7));
  }
  else {
    local_1b[2] = 0xf3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(codeGen,local_1b + 2);
    local_1b[1] = 0xf;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_offset_local,local_1b + 1);
    local_1b[0] = '\x10';
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(_offset_local,local_1b);
    local_1c = local_12 | 0x80 | local_11 << 3;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(_offset_local,&local_1c);
  }
  i._0_4_ = local_18;
  for (local_30 = 0; local_30 < 4; local_30 = local_30 + 1) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (_offset_local,(value_type_conflict1 *)((long)&i + local_30));
  }
  return;
}

Assistant:

void Amd64Backend::moveMemoryRegWithIntOffsetToReg(CodeGen& codeGen, FloatRegisters dest, Registers srcMemReg, int offset) {
		if (srcMemReg != Registers::SP) {
			codeGen.push_back(0xf3);
			codeGen.push_back(0x0f);
			codeGen.push_back(0x10);
			codeGen.push_back(0x80 | (Byte)srcMemReg | ((Byte)dest << 3));
		} else {
			codeGen.push_back(0xf3);
			codeGen.push_back(0x0f);
			codeGen.push_back(0x10);
			codeGen.push_back(0x84 | ((Byte)dest << 3));
			codeGen.push_back(0x24);
		}

		IntToBytes converter;
		converter.intValue = offset;

		for (std::size_t i = 0; i < sizeof(int); i++) {
			codeGen.push_back(converter.byteValues[i]);
		}
	}